

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

char * sqlite3_vtab_collation(sqlite3_index_info *pIdxInfo,int iCons)

{
  Expr *p;
  CollSeq *pCVar1;
  char *pcVar2;
  
  if ((-1 < iCons) && (iCons < pIdxInfo->nConstraint)) {
    p = *(Expr **)(*(long *)(*(long *)(pIdxInfo + 1) + 0x20) +
                  (long)pIdxInfo->aConstraint[(uint)iCons].iTermOffset * 0x38);
    if (p->pLeft == (Expr *)0x0) {
      pCVar1 = (CollSeq *)0x0;
    }
    else {
      pCVar1 = sqlite3ExprCompareCollSeq((Parse *)pIdxInfo[1].aConstraint,p);
    }
    if (pCVar1 == (CollSeq *)0x0) {
      pcVar2 = "BINARY";
    }
    else {
      pcVar2 = pCVar1->zName;
    }
    return pcVar2;
  }
  return (char *)0x0;
}

Assistant:

SQLITE_API const char *sqlite3_vtab_collation(sqlite3_index_info *pIdxInfo, int iCons){
  HiddenIndexInfo *pHidden = (HiddenIndexInfo*)&pIdxInfo[1];
  const char *zRet = 0;
  if( iCons>=0 && iCons<pIdxInfo->nConstraint ){
    CollSeq *pC = 0;
    int iTerm = pIdxInfo->aConstraint[iCons].iTermOffset;
    Expr *pX = pHidden->pWC->a[iTerm].pExpr;
    if( pX->pLeft ){
      pC = sqlite3ExprCompareCollSeq(pHidden->pParse, pX);
    }
    zRet = (pC ? pC->zName : sqlite3StrBINARY);
  }
  return zRet;
}